

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_key.cpp
# Opt level: O0

string * __thiscall
cfd::core::Privkey::ConvertWif_abi_cxx11_
          (string *__return_storage_ptr__,Privkey *this,NetType net_type,bool is_compressed)

{
  int iVar1;
  uchar *puVar2;
  size_t sVar3;
  CfdException *this_00;
  char *wally_string;
  allocator local_b9;
  string local_b8;
  string local_98;
  CfdSourceLocation local_78;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_50 [28];
  int local_34;
  WallyUtil *pWStack_30;
  int ret;
  char *wif_ptr;
  uint32_t flags;
  uint32_t prefix;
  bool is_compressed_local;
  Privkey *pPStack_18;
  NetType net_type_local;
  Privkey *this_local;
  string *wif;
  
  wif_ptr._4_4_ = 0xef;
  if (net_type == kMainnet) {
    wif_ptr._4_4_ = 0x80;
  }
  wif_ptr._0_4_ = (byte)~is_compressed & 1;
  pWStack_30 = (WallyUtil *)0x0;
  flags._3_1_ = is_compressed;
  prefix = net_type;
  pPStack_18 = this;
  this_local = (Privkey *)__return_storage_ptr__;
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50,&this->data_)
  ;
  puVar2 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(local_50);
  sVar3 = ByteData::GetDataSize(&this->data_);
  iVar1 = wally_wif_from_bytes(puVar2,sVar3,wif_ptr._4_4_,(uint)wif_ptr,&stack0xffffffffffffffd0);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(local_50);
  local_34 = iVar1;
  if (iVar1 == 0) {
    WallyUtil::ConvertStringAndFree_abi_cxx11_(__return_storage_ptr__,pWStack_30,wally_string);
    return __return_storage_ptr__;
  }
  local_78.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_key.cpp"
               ,0x2f);
  local_78.filename = local_78.filename + 1;
  local_78.line = 0x110;
  local_78.funcname = "ConvertWif";
  ByteData::GetHex_abi_cxx11_(&local_98,&this->data_);
  logger::warn<int&,std::__cxx11::string>
            (&local_78,"wally_wif_from_bytes error. ret={} bytes={}.",&local_34,&local_98);
  ::std::__cxx11::string::~string((string *)&local_98);
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_b8,"Error Private key to WIF.",&local_b9);
  CfdException::CfdException(this_00,kCfdIllegalArgumentError,&local_b8);
  __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

std::string Privkey::ConvertWif(NetType net_type, bool is_compressed) const {
  uint32_t prefix = (net_type == kMainnet ? kPrefixMainnet : kPrefixTestnet);
  uint32_t flags =
      (is_compressed ? WALLY_WIF_FLAG_COMPRESSED
                     : WALLY_WIF_FLAG_UNCOMPRESSED);
  char *wif_ptr = NULL;

  int ret = wally_wif_from_bytes(
      data_.GetBytes().data(), data_.GetDataSize(), prefix, flags, &wif_ptr);
  if (ret != WALLY_OK) {
    warn(
        CFD_LOG_SOURCE, "wally_wif_from_bytes error. ret={} bytes={}.", ret,
        data_.GetHex());
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Error Private key to WIF.");
  }
  std::string wif = WallyUtil::ConvertStringAndFree(wif_ptr);
  return wif;
}